

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O3

void Gla_ManExplorePPis(Gla_Man_t *p,Vec_Int_t *vPPis)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  Gla_Obj_t *pGVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  
  iVar1 = Gla_ManExplorePPis::Round + 1;
  if (0x33333332 < Gla_ManExplorePPis::Round * -0x33333333 + 0x19999999U) {
    iVar8 = vPPis->nSize;
    if (iVar8 < 1) {
      uVar7 = 0;
      Gla_ManExplorePPis::Round = iVar1;
    }
    else {
      piVar4 = vPPis->pArray;
      lVar10 = 0;
      uVar6 = Gla_ManExplorePPis::Round & 1;
      uVar7 = 0;
      Gla_ManExplorePPis::Round = iVar1;
      do {
        iVar1 = piVar4[lVar10];
        lVar11 = (long)iVar1;
        if ((lVar11 < 0) || (p->nObjs <= iVar1)) {
LAB_0060c2da:
          __assert_fail("i >= 0 && i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
        }
        pGVar5 = p->pObjs;
        uVar2 = *(uint *)&pGVar5[lVar11].field_0x4;
        if ((uVar2 & 1) != 0) {
          __assert_fail("pObj->fAbs == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGlaOld.c"
                        ,0x4fa,"void Gla_ManExplorePPis(Gla_Man_t *, Vec_Int_t *)");
        }
        if (0x1ff < uVar2) {
          uVar12 = 0;
          iVar9 = 0;
          do {
            uVar3 = pGVar5[lVar11].Fanins[uVar12];
            if (((long)(int)uVar3 < 0) || ((uint)p->nObjs <= uVar3)) goto LAB_0060c2da;
            iVar9 = iVar9 + (*(uint *)&pGVar5[(int)uVar3].field_0x4 & 1);
            uVar12 = uVar12 + 1;
          } while (uVar2 >> 9 != uVar12);
          if ((iVar9 != 0) && (iVar9 != 1 || uVar6 != 0)) {
            if (((int)uVar7 < 0) || (iVar8 <= (int)uVar7)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            uVar12 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
            piVar4[uVar12] = iVar1;
            iVar8 = vPPis->nSize;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar8);
    }
    if (iVar8 < (int)uVar7) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    vPPis->nSize = uVar7;
    iVar1 = Gla_ManExplorePPis::Round;
  }
  Gla_ManExplorePPis::Round = iVar1;
  return;
}

Assistant:

void Gla_ManExplorePPis( Gla_Man_t * p, Vec_Int_t * vPPis )
{
    static int Round = 0;
    Gla_Obj_t * pObj, * pFanin;
    int i, j, k, Count;
    if ( (Round++ % 5) == 0 )
        return;
    j = 0;
    Gla_ManForEachObjAbsVec( vPPis, p, pObj, i )
    {
        assert( pObj->fAbs == 0 );
        Count = 0;
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            Count += pFanin->fAbs;
        if ( Count == 0 || ((Round & 1) && Count == 1) )
            continue;
        Vec_IntWriteEntry( vPPis, j++, Gla_ObjId(p, pObj) );
    }
//    printf( "\n%d -> %d\n", Vec_IntSize(vPPis), j );
    Vec_IntShrink( vPPis, j );
}